

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O3

int zhash_iterator_next_volatile(zhash_iterator_t *zit,void *outkey,void *outvalue)

{
  int iVar1;
  zhash_t *pzVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  
  pzVar2 = zit->czh;
  iVar1 = pzVar2->nentries;
  iVar5 = zit->last_entry;
  do {
    iVar5 = iVar5 + 1;
    if (iVar1 <= iVar5) {
      return 0;
    }
    zit->last_entry = iVar5;
    pcVar3 = pzVar2->entries;
    lVar6 = (long)iVar5 * (long)pzVar2->entrysz;
  } while (pcVar3[lVar6] == '\0');
  lVar6 = (long)(int)lVar6;
  sVar4 = pzVar2->keysz;
  if (outkey != (void *)0x0) {
    *(char **)outkey = pcVar3 + lVar6 + 1;
  }
  if (outvalue != (void *)0x0) {
    *(char **)outvalue = pcVar3 + lVar6 + sVar4 + 1;
  }
  return 1;
}

Assistant:

int zhash_iterator_next_volatile(zhash_iterator_t *zit, void *outkey, void *outvalue)
{
    const zhash_t *zh = zit->czh;

    while (1) {
        if (zit->last_entry + 1 >= zh->nentries)
            return 0;

        zit->last_entry++;

        if (zh->entries[zit->last_entry * zh->entrysz]) {
            void *this_key = &zh->entries[zit->last_entry * zh->entrysz + 1];
            void *this_value = &zh->entries[zit->last_entry * zh->entrysz + 1 + zh->keysz];

            if (outkey != NULL)
                *((void**) outkey) = this_key;
            if (outvalue != NULL)
                *((void**) outvalue) = this_value;

            return 1;
        }
    }
}